

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.h
# Opt level: O0

SmartPointer<GEO::Counted> * __thiscall
GEO::SmartPointer<GEO::Counted>::operator=(SmartPointer<GEO::Counted> *this,Counted *ptr)

{
  Counted *ptr_local;
  SmartPointer<GEO::Counted> *this_local;
  
  if (ptr != this->pointer_) {
    Counted::unref(this->pointer_);
    this->pointer_ = ptr;
    Counted::ref(this->pointer_);
  }
  return this;
}

Assistant:

SmartPointer<T>& operator= (T* ptr) {
            if(ptr != pointer_) {
                T::unref(pointer_);
                pointer_ = ptr;
                T::ref(pointer_);
            }
            return *this;
        }